

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O1

bool okHessianDiagonal(HighsOptions *options,HighsHessian *hessian,ObjSense sense)

{
  char *format;
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  if ((long)hessian->dim_ < 1) {
    uVar1 = 0;
    dVar3 = INFINITY;
  }
  else {
    dVar3 = INFINITY;
    lVar2 = 0;
    uVar1 = 0;
    do {
      dVar4 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [(hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2]] * (double)sense;
      if (dVar4 <= dVar3) {
        dVar3 = dVar4;
      }
      uVar1 = uVar1 + (dVar4 < 0.0);
      lVar2 = lVar2 + 1;
    } while (hessian->dim_ != lVar2);
  }
  if (0 < (int)uVar1) {
    if (sense == kMinimize) {
      format = 
      "Hessian has %d diagonal entries in [%g, 0) so is not positive semidefinite for minimization\n"
      ;
    }
    else {
      dVar3 = -dVar3;
      format = 
      "Hessian has %d diagonal entries in (0, %g] so is not negative semidefinite for maximization\n"
      ;
    }
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,format,dVar3,(ulong)uVar1);
  }
  return (int)uVar1 < 1;
}

Assistant:

bool okHessianDiagonal(const HighsOptions& options, HighsHessian& hessian,
                       const ObjSense sense) {
  double min_diagonal_value = kHighsInf;
  double max_diagonal_value = -kHighsInf;
  const HighsInt dim = hessian.dim_;
  const HighsInt sense_sign = (HighsInt)sense;
  HighsInt num_illegal_diagonal_value = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    double diagonal_value = 0;
    // Assumes that the diagonal entry is always first, possibly with explicit
    // zero value
    HighsInt iEl = hessian.start_[iCol];
    assert(hessian.index_[iEl] == iCol);
    diagonal_value = sense_sign * hessian.value_[iEl];
    min_diagonal_value = std::min(diagonal_value, min_diagonal_value);
    max_diagonal_value = std::max(diagonal_value, max_diagonal_value);
    // Diagonal entries signed by sense must be non-negative
    if (diagonal_value < 0) num_illegal_diagonal_value++;
  }

  const bool certainly_not_positive_semidefinite =
      num_illegal_diagonal_value > 0;
  if (certainly_not_positive_semidefinite) {
    if (sense == ObjSense::kMinimize) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Hessian has %" HIGHSINT_FORMAT
                   " diagonal entries in [%g, 0) so is not positive "
                   "semidefinite for minimization\n",
                   num_illegal_diagonal_value, min_diagonal_value);
    } else {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Hessian has %" HIGHSINT_FORMAT
                   " diagonal entries in (0, %g] so is not negative "
                   "semidefinite for maximization\n",
                   num_illegal_diagonal_value, -min_diagonal_value);
    }
  }
  return !certainly_not_positive_semidefinite;
}